

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_clampVecScalarScalar_uvec3(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  int i;
  uint uVar4;
  long lVar5;
  uint uVar6;
  int i_1;
  Vector<unsigned_int,_3> res;
  Vector<unsigned_int,_3> res_1;
  Vector<float,_3> res_2;
  float local_24 [3];
  int local_18 [6];
  
  local_24[0] = c->in[0].m_data[2];
  local_24[1] = c->in[0].m_data[0];
  local_24[2] = c->in[0].m_data[1];
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  lVar5 = 0;
  do {
    res.m_data[lVar5] = (uint)(long)local_24[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  fVar1 = c->in[1].m_data[0];
  fVar2 = c->in[2].m_data[1];
  res_1.m_data[2] = 0;
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  lVar5 = 0;
  do {
    uVar3 = res.m_data[lVar5];
    uVar6 = (uint)(long)fVar2;
    if (uVar3 < uVar6) {
      uVar6 = uVar3;
    }
    uVar4 = (uint)(long)fVar1;
    if (uVar3 < uVar4) {
      uVar6 = uVar4;
    }
    res_1.m_data[lVar5] = uVar6;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  res_2.m_data[2] = 0.0;
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  lVar5 = 0;
  do {
    res_2.m_data[lVar5] = (float)res_1.m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_18[2] = 0;
  local_18[3] = 1;
  local_18[4] = 2;
  lVar5 = 2;
  do {
    (c->color).m_data[local_18[lVar5]] = (float)res_1.m_data[lVar5 + 2];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }